

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::ScanfFunc::ScanfFunc(ScanfFunc *this,bool isFscanf)

{
  undefined7 in_register_00000031;
  
  SystemSubroutine::SystemSubroutine
            (&this->super_SystemSubroutine,
             (KnownSystemName)CONCAT71(in_register_00000031,isFscanf) ^ SScanf,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005b1538;
  this->isFscanf = isFscanf;
  (this->super_SystemSubroutine).hasOutputArgs = true;
  return;
}

Assistant:

explicit ScanfFunc(bool isFscanf) :
        SystemSubroutine(isFscanf ? KnownSystemName::FScanf : KnownSystemName::SScanf,
                         SubroutineKind::Function),
        isFscanf(isFscanf) {
        hasOutputArgs = true;
    }